

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O0

void nhdp_domain_store_willingness(nhdp_link *lnk)

{
  int iVar1;
  nhdp_neighbor *pnVar2;
  list_entity *plVar3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  nhdp_domain *domain;
  nhdp_neighbor_domaindata *neighdata;
  nhdp_link *lnk_local;
  
  lnk->flooding_willingness = _flooding_domain._tmp_willingness;
  plVar3 = _domain_list.next;
  if ((log_global_mask[LOG_NHDP_R] & 1) != 0) {
    oonf_log(LOG_SEVERITY_DEBUG,LOG_NHDP_R,"src/nhdp/nhdp/nhdp_domain.c",0x2ea,(void *)0x0,0,
             "Set flooding willingness: %u",(uint)lnk->flooding_willingness);
    plVar3 = _domain_list.next;
  }
  for (; plVar3->prev != _domain_list.prev; plVar3 = plVar3->next) {
    pnVar2 = lnk->neigh;
    iVar1 = *(int *)((long)&plVar3[-0x27].next + 4);
    pnVar2->_domaindata[iVar1].willingness = *(uint8_t *)((long)&plVar3[-0x27].prev + 1);
    if ((log_global_mask[LOG_NHDP_R] & 1) != 0) {
      oonf_log(LOG_SEVERITY_DEBUG,LOG_NHDP_R,"src/nhdp/nhdp/nhdp_domain.c",0x2ef,(void *)0x0,0,
               "Set routing willingness for domain %u: %u",
               (uint)*(byte *)((long)&plVar3[-0x27].next + 1),
               (uint)pnVar2->_domaindata[iVar1].willingness);
    }
  }
  return;
}

Assistant:

void
nhdp_domain_store_willingness(struct nhdp_link *lnk) {
  struct nhdp_neighbor_domaindata *neighdata;
  struct nhdp_domain *domain;

  lnk->flooding_willingness = _flooding_domain._tmp_willingness;
  OONF_DEBUG(LOG_NHDP_R, "Set flooding willingness: %u", lnk->flooding_willingness);

  list_for_each_element(&_domain_list, domain, _node) {
    neighdata = nhdp_domain_get_neighbordata(domain, lnk->neigh);
    neighdata->willingness = domain->_tmp_willingness;
    OONF_DEBUG(LOG_NHDP_R, "Set routing willingness for domain %u: %u", domain->ext, neighdata->willingness);
  }
}